

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_rejects_table.cpp
# Opt level: O2

TableCatalogEntry * __thiscall
duckdb::CSVRejectsTable::GetScansTable(CSVRejectsTable *this,ClientContext *context)

{
  TableCatalogEntry *pTVar1;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_50,"temp",(allocator *)&local_30);
  Catalog::GetCatalog(context,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string((string *)&local_50,"temp",&local_51);
  ::std::__cxx11::string::string((string *)&local_30,"main",&local_52);
  pTVar1 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                     (context,&local_50,&local_30,&this->scan_table,
                      (QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  return pTVar1;
}

Assistant:

TableCatalogEntry &CSVRejectsTable::GetScansTable(ClientContext &context) {
	auto &temp_catalog = Catalog::GetCatalog(context, TEMP_CATALOG);
	auto &table_entry = temp_catalog.GetEntry<TableCatalogEntry>(context, TEMP_CATALOG, DEFAULT_SCHEMA, scan_table);
	return table_entry;
}